

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O1

cmList * __thiscall cmList::filter(cmList *this,string_view pattern,FilterMode mode)

{
  pointer pbVar1;
  cmList *pcVar2;
  bool bVar3;
  invalid_argument *this_00;
  pointer pbVar4;
  long lVar5;
  iterator __first;
  RegularExpression regex;
  string local_298;
  cmList *local_278;
  basic_string_view<char,_std::char_traits<char>_> local_270;
  RegularExpression local_260;
  
  local_270._M_str = pattern._M_str;
  local_270._M_len = pattern._M_len;
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_298,local_270._M_str,local_270._M_str + local_270._M_len);
  local_260.regmust = (char *)0x0;
  local_260.program = (char *)0x0;
  local_260.progsize = 0;
  memset(&local_260,0,0x20a);
  cmsys::RegularExpression::compile(&local_260,local_298._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if (local_260.program == (char *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    cmStrCat<char_const(&)[57],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[3]>
              (&local_298,(char (*) [57])"sub-command FILTER, mode REGEX failed to compile regex \""
               ,&local_270,(char (*) [3])0x9361e8);
    std::invalid_argument::invalid_argument(this_00,(string *)&local_298);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pbVar4 = (this->Values).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->Values).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pbVar1 - (long)pbVar4 >> 7;
  local_278 = this;
  if (0 < lVar5) {
    lVar5 = lVar5 + 1;
    pbVar4 = pbVar4 + 2;
    do {
      __first._M_current = pbVar4;
      bVar3 = cmsys::RegularExpression::find
                        (&local_260,__first._M_current[-2]._M_dataplus._M_p,&local_260.regmatch);
      if ((mode == INCLUDE) != bVar3) {
        __first._M_current = __first._M_current + -2;
        goto LAB_003459aa;
      }
      bVar3 = cmsys::RegularExpression::find
                        (&local_260,__first._M_current[-1]._M_dataplus._M_p,&local_260.regmatch);
      if ((mode == INCLUDE) != bVar3) {
        __first._M_current = __first._M_current + -1;
        goto LAB_003459aa;
      }
      bVar3 = cmsys::RegularExpression::find
                        (&local_260,((__first._M_current)->_M_dataplus)._M_p,&local_260.regmatch);
      if ((mode == INCLUDE) != bVar3) goto LAB_003459aa;
      bVar3 = cmsys::RegularExpression::find
                        (&local_260,__first._M_current[1]._M_dataplus._M_p,&local_260.regmatch);
      if ((mode == INCLUDE) != bVar3) {
        __first._M_current = __first._M_current + 1;
        goto LAB_003459aa;
      }
      lVar5 = lVar5 + -1;
      pbVar4 = __first._M_current + 4;
    } while (1 < lVar5);
    pbVar4 = __first._M_current + 2;
  }
  lVar5 = (long)pbVar1 - (long)pbVar4 >> 5;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      __first._M_current = pbVar1;
      if ((lVar5 != 3) ||
         (bVar3 = cmsys::RegularExpression::find
                            (&local_260,(pbVar4->_M_dataplus)._M_p,&local_260.regmatch),
         __first._M_current = pbVar4, (mode == INCLUDE) != bVar3)) goto LAB_003459aa;
      pbVar4 = pbVar4 + 1;
    }
    bVar3 = cmsys::RegularExpression::find
                      (&local_260,(pbVar4->_M_dataplus)._M_p,&local_260.regmatch);
    __first._M_current = pbVar4;
    if ((mode == INCLUDE) != bVar3) goto LAB_003459aa;
    pbVar4 = pbVar4 + 1;
  }
  bVar3 = cmsys::RegularExpression::find(&local_260,(pbVar4->_M_dataplus)._M_p,&local_260.regmatch);
  __first._M_current = pbVar4;
  if ((mode == INCLUDE) == bVar3) {
    __first._M_current = pbVar1;
  }
LAB_003459aa:
  pbVar4 = __first._M_current + 1;
  if (pbVar4 != pbVar1 && __first._M_current != pbVar1) {
    do {
      bVar3 = cmsys::RegularExpression::find
                        (&local_260,(pbVar4->_M_dataplus)._M_p,&local_260.regmatch);
      if ((mode == INCLUDE) == bVar3) {
        std::__cxx11::string::operator=((string *)__first._M_current,(string *)pbVar4);
        __first._M_current = __first._M_current + 1;
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar1);
  }
  pcVar2 = local_278;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_278->Values,__first,
             (local_278->Values).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if (local_260.program != (char *)0x0) {
    operator_delete__(local_260.program);
  }
  return pcVar2;
}

Assistant:

cmList& cmList::filter(cm::string_view pattern, FilterMode mode)
{
  cmsys::RegularExpression regex(std::string{ pattern });
  if (!regex.is_valid()) {
    throw std::invalid_argument(
      cmStrCat("sub-command FILTER, mode REGEX failed to compile regex \"",
               pattern, "\"."));
  }

  auto it = std::remove_if(this->Values.begin(), this->Values.end(),
                           MatchesRegex{ regex, mode });
  this->Values.erase(it, this->Values.end());

  return *this;
}